

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O1

int re2::Regexp::FactorAlternation(Regexp **sub,int nsub,ParseFlags flags)

{
  vector<re2::Splice,_std::allocator<re2::Splice>_> *splices;
  int iVar1;
  pointer pSVar2;
  pointer pFVar3;
  uint uVar4;
  Regexp **ppRVar5;
  Regexp *pRVar6;
  ulong uVar7;
  long lVar8;
  pointer extraout_RDX;
  pointer extraout_RDX_00;
  Regexp **ppRVar9;
  pointer pSVar10;
  pointer pSVar11;
  int iVar12;
  int nsuffix;
  int iVar13;
  ulong uVar14;
  vector<re2::Frame,_std::allocator<re2::Frame>_> stk;
  Regexp *re [2];
  int local_1ec;
  vector<re2::Frame,_std::allocator<re2::Frame>_> local_1e8;
  int local_1c4;
  Regexp **local_1c0;
  LogMessage local_1b8;
  
  local_1e8.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e8.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1c4 = nsub;
  local_1c0 = sub;
  std::vector<re2::Frame,std::allocator<re2::Frame>>::emplace_back<re2::Regexp**&,int&>
            ((vector<re2::Frame,std::allocator<re2::Frame>> *)&local_1e8,&local_1c0,&local_1c4);
  pSVar10 = extraout_RDX;
  do {
    pFVar3 = local_1e8.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pSVar11 = local_1e8.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
              super__Vector_impl_data._M_finish[-1].splices.
              super__Vector_base<re2::Splice,_std::allocator<re2::Splice>_>._M_impl.
              super__Vector_impl_data._M_start;
    pSVar2 = local_1e8.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
             super__Vector_impl_data._M_finish[-1].splices.
             super__Vector_base<re2::Splice,_std::allocator<re2::Splice>_>._M_impl.
             super__Vector_impl_data._M_finish;
    iVar1 = local_1ec;
    if (pSVar11 == pSVar2) {
LAB_00256f60:
      uVar4 = pFVar3[-1].round;
      pFVar3[-1].round = uVar4 + 1;
      if (3 < uVar4) {
        LogMessage::LogMessage
                  (&local_1b8,
                   "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O1/_deps/re2-src/re2/parse.cc"
                   ,0x3fa);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b8.str_,"unknown round: ",0xf);
        std::ostream::operator<<(&local_1b8.str_,pFVar3[-1].round);
LAB_002570ee:
        LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b8);
      }
      splices = &pFVar3[-1].splices;
      switch(uVar4) {
      case 0:
        FactorAlternationImpl::Round1(pFVar3[-1].sub,pFVar3[-1].nsub,(ParseFlags)pSVar10,splices);
        break;
      case 1:
        FactorAlternationImpl::Round2(pFVar3[-1].sub,pFVar3[-1].nsub,(ParseFlags)pSVar10,splices);
        break;
      case 2:
        FactorAlternationImpl::Round3(pFVar3[-1].sub,pFVar3[-1].nsub,flags,splices);
        break;
      case 3:
        iVar1 = pFVar3[-1].nsub;
        iVar12 = 1;
        if ((long)local_1e8.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_1e8.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
                  super__Vector_impl_data._M_start != 0x30) {
          pSVar10 = local_1e8.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
                    super__Vector_impl_data._M_finish[-1].splices.
                    super__Vector_base<re2::Splice,_std::allocator<re2::Splice>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pFVar3 = local_1e8.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
                   super__Vector_impl_data._M_finish + -1;
          if (pSVar10 != (pointer)0x0) {
            pFVar3 = local_1e8.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
                     super__Vector_impl_data._M_finish + -1;
            local_1e8.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_1e8.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
                 super__Vector_impl_data._M_finish + -1;
            operator_delete(pSVar10,(long)(pFVar3->splices).
                                          super__Vector_base<re2::Splice,_std::allocator<re2::Splice>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)pSVar10);
            pFVar3 = local_1e8.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          }
          local_1e8.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
          super__Vector_impl_data._M_finish = pFVar3;
          iVar13 = local_1e8.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
                   super__Vector_impl_data._M_finish[-1].spliceidx;
          pSVar10 = local_1e8.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
                    super__Vector_impl_data._M_finish[-1].splices.
                    super__Vector_base<re2::Splice,_std::allocator<re2::Splice>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pSVar10[iVar13].nsuffix = iVar1;
          local_1e8.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
          super__Vector_impl_data._M_finish[-1].spliceidx = iVar13 + 1;
          iVar12 = 3;
          iVar1 = local_1ec;
        }
        goto LAB_00256ffb;
      }
      pSVar11 = pFVar3[-1].splices.super__Vector_base<re2::Splice,_std::allocator<re2::Splice>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pSVar2 = pFVar3[-1].splices.super__Vector_base<re2::Splice,_std::allocator<re2::Splice>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if ((pSVar11 == pSVar2) || (pSVar10 = (pointer)0x0, pFVar3[-1].round == 3)) {
        pSVar10 = (pointer)(ulong)(uint)((int)((ulong)((long)pSVar2 - (long)pSVar11) >> 3) *
                                        -0x55555555);
      }
      pFVar3[-1].spliceidx = (int)pSVar10;
      iVar12 = 0;
    }
    else {
      iVar13 = local_1e8.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
               super__Vector_impl_data._M_finish[-1].spliceidx;
      iVar12 = (int)((ulong)((long)pSVar2 - (long)pSVar11) >> 3);
      if (SBORROW4(iVar13,iVar12 * -0x55555555) == iVar13 + iVar12 * 0x55555555 < 0) {
        if (local_1e8.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
            super__Vector_impl_data._M_finish[-1].nsub < 1) {
          iVar13 = 0;
        }
        else {
          iVar12 = 0;
          uVar14 = 0;
          do {
            ppRVar5 = pFVar3[-1].sub;
            ppRVar9 = ppRVar5 + iVar12;
            if (ppRVar9 < pSVar11->sub) {
              uVar14 = (ulong)(int)uVar14;
              lVar8 = (long)iVar12 << 3;
              do {
                ppRVar5[uVar14] = *ppRVar9;
                uVar14 = uVar14 + 1;
                ppRVar5 = pFVar3[-1].sub;
                ppRVar9 = (Regexp **)((long)ppRVar5 + lVar8 + 8);
                iVar12 = iVar12 + 1;
                lVar8 = lVar8 + 8;
              } while (ppRVar9 < pSVar11->sub);
            }
            iVar13 = (int)uVar14;
            if (pFVar3[-1].round - 1U < 2) {
              local_1b8._0_8_ = pSVar11->prefix;
              local_1b8.str_.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
                   = (_func_int **)AlternateNoFactor(pSVar11->sub,pSVar11->nsuffix,flags);
              pRVar6 = Concat((Regexp **)&local_1b8,2,flags);
              pFVar3[-1].sub[iVar13] = pRVar6;
            }
            else {
              if (pFVar3[-1].round != 3) {
                LogMessage::LogMessage
                          (&local_1b8,
                           "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O1/_deps/re2-src/re2/parse.cc"
                           ,0x3d3);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_1b8.str_,"unknown round: ",0xf);
                std::ostream::operator<<(&local_1b8.str_,pFVar3[-1].round);
                goto LAB_002570ee;
              }
              ppRVar5[iVar13] = pSVar11->prefix;
            }
            pSVar10 = (pointer)(long)iVar13;
            uVar4 = pSVar11->nsub + iVar12;
            uVar7 = (ulong)uVar4;
            uVar14 = (ulong)(iVar13 + 1U);
            pSVar11 = pSVar11 + 1;
            if ((pSVar11 ==
                 pFVar3[-1].splices.super__Vector_base<re2::Splice,_std::allocator<re2::Splice>_>.
                 _M_impl.super__Vector_impl_data._M_finish) &&
               (iVar12 = pFVar3[-1].nsub, (int)uVar4 < iVar12)) {
              uVar7 = (ulong)(int)uVar4;
              uVar14 = (ulong)(int)(iVar13 + 1U);
              do {
                pSVar10 = (pointer)pFVar3[-1].sub;
                ppRVar9 = &pSVar10->prefix + uVar7;
                uVar7 = uVar7 + 1;
                (&pSVar10->prefix)[uVar14] = *ppRVar9;
                uVar14 = uVar14 + 1;
              } while ((long)uVar7 < (long)iVar12);
            }
            iVar13 = (int)uVar14;
            iVar12 = (int)uVar7;
          } while (iVar12 < pFVar3[-1].nsub);
        }
        pSVar11 = pFVar3[-1].splices.super__Vector_base<re2::Splice,_std::allocator<re2::Splice>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if (pFVar3[-1].splices.super__Vector_base<re2::Splice,_std::allocator<re2::Splice>_>._M_impl
            .super__Vector_impl_data._M_finish != pSVar11) {
          pFVar3[-1].splices.super__Vector_base<re2::Splice,_std::allocator<re2::Splice>_>._M_impl.
          super__Vector_impl_data._M_finish = pSVar11;
        }
        pFVar3[-1].nsub = iVar13;
        goto LAB_00256f60;
      }
      iVar12 = 3;
      std::vector<re2::Frame,std::allocator<re2::Frame>>::emplace_back<re2::Regexp**&,int&>
                ((vector<re2::Frame,std::allocator<re2::Frame>> *)&local_1e8,&pSVar11[iVar13].sub,
                 &pSVar11[iVar13].nsub);
      pSVar10 = extraout_RDX_00;
    }
LAB_00256ffb:
    local_1ec = iVar1;
    if ((iVar12 != 0) && (iVar12 != 3)) {
      std::vector<re2::Frame,_std::allocator<re2::Frame>_>::~vector(&local_1e8);
      return local_1ec;
    }
  } while( true );
}

Assistant:

int Regexp::FactorAlternation(Regexp** sub, int nsub, ParseFlags flags) {
  std::vector<Frame> stk;
  stk.emplace_back(sub, nsub);

  for (;;) {
    auto& sub = stk.back().sub;
    auto& nsub = stk.back().nsub;
    auto& round = stk.back().round;
    auto& splices = stk.back().splices;
    auto& spliceidx = stk.back().spliceidx;

    if (splices.empty()) {
      // Advance to the next round of factoring. Note that this covers
      // the initialised state: when splices is empty and round is 0.
      round++;
    } else if (spliceidx < static_cast<int>(splices.size())) {
      // We have at least one more Splice to factor. Recurse logically.
      stk.emplace_back(splices[spliceidx].sub, splices[spliceidx].nsub);
      continue;
    } else {
      // We have no more Splices to factor. Apply them.
      auto iter = splices.begin();
      int out = 0;
      for (int i = 0; i < nsub; ) {
        // Copy until we reach where the next Splice begins.
        while (sub + i < iter->sub)
          sub[out++] = sub[i++];
        switch (round) {
          case 1:
          case 2: {
            // Assemble the Splice prefix and the suffixes.
            Regexp* re[2];
            re[0] = iter->prefix;
            re[1] = Regexp::AlternateNoFactor(iter->sub, iter->nsuffix, flags);
            sub[out++] = Regexp::Concat(re, 2, flags);
            i += iter->nsub;
            break;
          }
          case 3:
            // Just use the Splice prefix.
            sub[out++] = iter->prefix;
            i += iter->nsub;
            break;
          default:
            LOG(DFATAL) << "unknown round: " << round;
            break;
        }
        // If we are done, copy until the end of sub.
        if (++iter == splices.end()) {
          while (i < nsub)
            sub[out++] = sub[i++];
        }
      }
      splices.clear();
      nsub = out;
      // Advance to the next round of factoring.
      round++;
    }

    switch (round) {
      case 1:
        FactorAlternationImpl::Round1(sub, nsub, flags, &splices);
        break;
      case 2:
        FactorAlternationImpl::Round2(sub, nsub, flags, &splices);
        break;
      case 3:
        FactorAlternationImpl::Round3(sub, nsub, flags, &splices);
        break;
      case 4:
        if (stk.size() == 1) {
          // We are at the top of the stack. Just return.
          return nsub;
        } else {
          // Pop the stack and set the number of suffixes.
          // (Note that references will be invalidated!)
          int nsuffix = nsub;
          stk.pop_back();
          stk.back().splices[stk.back().spliceidx].nsuffix = nsuffix;
          ++stk.back().spliceidx;
          continue;
        }
      default:
        LOG(DFATAL) << "unknown round: " << round;
        break;
    }

    // Set spliceidx depending on whether we have Splices to factor.
    if (splices.empty() || round == 3) {
      spliceidx = static_cast<int>(splices.size());
    } else {
      spliceidx = 0;
    }
  }
}